

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnf.hpp
# Opt level: O2

void bal::Cnf::print_clause(ostream *stream,uint32_t *p_clause,char *final_token)

{
  uint uVar1;
  ostream *poVar2;
  uint uVar3;
  char *pcVar4;
  int i;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  literal_t local_48;
  literal_t local_44;
  ulong local_40;
  ulong local_38;
  
  uVar1 = *p_clause;
  uVar3 = uVar1 & 0xffff;
  if (uVar1 < 0x10000 || 4 < uVar3) {
    for (uVar7 = 0; uVar3 != uVar7; uVar7 = uVar7 + 1) {
      pcVar4 = " ";
      if (uVar7 == 0) {
        pcVar4 = "";
      }
      poVar2 = std::operator<<(stream,pcVar4);
      local_48.id_ = p_clause[uVar7 + 1];
      operator<<(poVar2,&local_48);
    }
    if (final_token != (char *)0x0) {
      std::operator<<(stream,final_token);
    }
  }
  else {
    uVar7 = 0;
    for (uVar5 = (ulong)(uVar1 >> 0x10); (int)uVar5 != 0; uVar5 = uVar5 >> 1 & 0x7fffffff) {
      if ((uVar5 & 1) != 0) {
        uVar1 = (uint)uVar7;
        local_40 = uVar7;
        local_38 = uVar5;
        for (uVar6 = 0; uVar5 = local_38, uVar7 = local_40, uVar3 != uVar6; uVar6 = uVar6 + 1) {
          local_44.id_ = (uint)((~(uVar1 & 0xffff) >> ((uint)uVar6 & 0x1f) & 1) != 0) ^
                         p_clause[uVar6 + 1];
          pcVar4 = " ";
          if (uVar6 == 0) {
            pcVar4 = "";
          }
          poVar2 = std::operator<<(stream,pcVar4);
          operator<<(poVar2,&local_44);
        }
        if (final_token != (char *)0x0) {
          std::operator<<(stream,final_token);
        }
      }
      uVar7 = (ulong)((int)uVar7 + 1);
    }
  }
  return;
}

Assistant:

inline static void print_clause(std::ostream& stream, const uint32_t* const p_clause, const char* final_token = nullptr) {
            uint16_t clauses_bitmap = *p_clause >> 16;
            const clause_size_t literals_size = (*p_clause & 0xFFFF);
            
            if (literals_size <= 4 && clauses_bitmap != 0) {
                uint16_t clause_bitmap = 0;
                while (clauses_bitmap > 0) {
                    if (clauses_bitmap & 1) {
                        for (auto i = 0; i < literals_size; i++) {
                            literal_t literal(*(p_clause + i + 1));
                            literal.negate((clause_bitmap & (1 << i)) == 0);
                            stream << ((i > 0) ? " " : "") << literal;
                        };
                        
                        if (final_token != nullptr) {
                            stream << final_token;
                        };
                    };
                    clause_bitmap++;
                    clauses_bitmap >>= 1;
                };
            } else {
                for (auto i = 0; i < literals_size; i++) {
                    stream << ((i > 0) ? " " : "") << literal_t(*(p_clause + i + 1));
                };
                
                if (final_token != nullptr) {
                    stream << final_token;
                };
            };
        }